

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O0

void __thiscall
ValidationSignals::CallFunctionInValidationInterfaceQueue
          (ValidationSignals *this,function<void_()> *func)

{
  function<void_()> *this_00;
  function<void_()> *in_RSI;
  long in_FS_OFFSET;
  function<void_()> *in_stack_ffffffffffffff98;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>::operator->
            ((unique_ptr<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_> *)
             in_stack_ffffffffffffff98);
  this_00 = (function<void_()> *)
            std::
            unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>::
            operator->((unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                        *)in_stack_ffffffffffffff98);
  std::function<void_()>::function(this_00,in_RSI);
  (**(code **)(*(long *)&(this_00->super__Function_base)._M_functor + 0x10))(this_00,local_28);
  std::function<void_()>::~function(in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ValidationSignals::CallFunctionInValidationInterfaceQueue(std::function<void()> func)
{
    m_internals->m_task_runner->insert(std::move(func));
}